

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O0

void unlink_release(ll_head *q_head,ll_elem *n,int inslock)

{
  int iVar1;
  ll_elem *plVar2;
  ulong uVar3;
  elem_ptr_t eVar4;
  bool bVar5;
  ulong local_a8;
  ulong local_88;
  uintptr_t ns;
  int s_cas;
  int p_cas;
  ll_elem *s;
  ll_elem *p;
  ll_elem *plStack_18;
  int inslock_local;
  ll_elem *n_local;
  ll_head *q_head_local;
  
  p._4_4_ = inslock;
  plStack_18 = n;
  n_local = &q_head->q;
  plVar2 = ptr_clear(n);
  if (n != plVar2) {
    __assert_fail("n == ptr_clear(n)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x2f4,
                  "void unlink_release(struct ll_head *, struct ll_elem *, int)");
  }
  do {
  } while (1 < plStack_18->refcnt);
  _s_cas = ptr_clear((ll_elem *)plStack_18->succ);
  s = flag_combine((ll_elem *)plStack_18->pred,(ll_elem *)0x2);
  if ((_s_cas == (ll_elem *)0x0) || (s == (ll_elem *)0x0)) {
    __assert_fail("s != NULL && p != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x2fe,
                  "void unlink_release(struct ll_head *, struct ll_elem *, int)");
  }
  if (p._4_4_ != 0) {
    local_88 = plStack_18->succ;
    do {
      LOCK();
      uVar3 = plStack_18->succ;
      bVar5 = local_88 == uVar3;
      if (bVar5) {
        plStack_18->succ = local_88 | 2;
        uVar3 = local_88;
      }
      UNLOCK();
      local_88 = uVar3;
    } while (!bVar5);
    if ((uVar3 & 2) != 0) {
      __assert_fail("!(ns & FLAGGED)",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                    0x30d,"void unlink_release(struct ll_head *, struct ll_elem *, int)");
    }
    _s_cas = flag_combine(_s_cas,(ll_elem *)0x2);
  }
  iVar1 = ptr_cas(&plStack_18->succ,(ll_elem **)&s_cas,(ll_elem *)0x0);
  if (iVar1 == 0) {
    __assert_fail("s_cas",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x311,
                  "void unlink_release(struct ll_head *, struct ll_elem *, int)");
  }
  ptr_clear_deref(&plStack_18->succ);
  deref_release((ll_head *)n_local,_s_cas,1);
  iVar1 = ptr_cas(&plStack_18->pred,&s,(ll_elem *)0x0);
  if (iVar1 == 0) {
    __assert_fail("p_cas",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x316,
                  "void unlink_release(struct ll_head *, struct ll_elem *, int)");
  }
  local_a8 = plStack_18->pred;
  do {
    LOCK();
    eVar4 = plStack_18->pred;
    bVar5 = local_a8 == eVar4;
    if (bVar5) {
      plStack_18->pred = local_a8 & 0xfffffffffffffffd;
      eVar4 = local_a8;
    }
    UNLOCK();
    local_a8 = eVar4;
  } while (!bVar5);
  ptr_clear_deref(&plStack_18->pred);
  deref_release((ll_head *)n_local,s,1);
  if (p._4_4_ == 0) {
    deref_release((ll_head *)n_local,plStack_18,1);
  }
  return;
}

Assistant:

static void
unlink_release(struct ll_head *q_head, struct ll_elem *n, int inslock)
{
	struct ll_elem	*p, *s;
	int		 p_cas, s_cas;

	assert(n == ptr_clear(n));

	/* Wait until the last reference to n, not held by us, goes away. */
	while (atomic_load_explicit(&n->refcnt, memory_order_relaxed) > 1)
		SPINWAIT();

	s = ptr_clear((struct ll_elem*)atomic_load_explicit(&n->succ,
	    memory_order_acquire));
	p = flag_combine((struct ll_elem*)atomic_load_explicit(&n->pred,
	    memory_order_acquire), (struct ll_elem*)FLAGGED);
	assert(s != NULL && p != NULL);

	/*
	 * Clear out the pred and succ pointers.
	 * Set succ to 0 before setting pred to 0, since the former is used to
	 * detect if the element is on the queue.
	 *
	 * Since ptr_cas maintains the FLAGGED bit, clear it manually
	 * afterwards.
	 */
	if (inslock) {
		uintptr_t ns;

		ns = atomic_fetch_or_explicit(&n->succ, FLAGGED,
		    memory_order_acq_rel);
		assert(!(ns & FLAGGED));
		s = flag_combine(s, (struct ll_elem*)FLAGGED);
	}
	s_cas = ptr_cas(&n->succ, &s, NULL);
	assert(s_cas);
	ptr_clear_deref(&n->succ);
	deref_release(q_head, s, 1);

	p_cas = ptr_cas(&n->pred, &p, NULL);
	assert(p_cas);
	atomic_fetch_and_explicit(&n->pred, ~FLAGGED, memory_order_release);
	ptr_clear_deref(&n->pred);
	deref_release(q_head, p, 1);

	/* Release our reference. */
	if (!inslock)
		deref_release(q_head, n, 1);
}